

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O1

void __thiscall
bgui::FileImageWindow::onKey(FileImageWindow *this,char c,SpecialKey key,int x,int y)

{
  uint *pos;
  _Base_ptr *pp_Var1;
  uint uVar2;
  uint uVar3;
  pointer pcVar4;
  pointer pbVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  ostream *poVar9;
  bool bVar10;
  char *pcVar11;
  long hp;
  long wp;
  long yp;
  long xp;
  Properties prop;
  string name;
  char *local_218;
  long local_210;
  char local_208 [16];
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  char *local_1a8;
  long local_1a0;
  char local_198 [96];
  ios_base local_138 [264];
  
  switch(key) {
  case k_left:
    if (this->current != 0) {
      this->current = this->current - 1;
LAB_00115fd9:
      bVar10 = false;
LAB_00116039:
      load(this,&this->current,bVar10,-1,-1,false);
    }
    break;
  case k_right:
    uVar2 = this->current;
    uVar3 = uVar2 + 1;
    this->current = uVar3;
    if ((ulong)uVar3 <
        (ulong)((long)(this->list).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->list).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
LAB_00116031:
      bVar10 = true;
      goto LAB_00116039;
    }
    this->current = uVar2;
    break;
  default:
    goto switchD_00115f96_caseD_4;
  case k_home:
    if (this->current != 0) {
      this->current = 0;
      goto LAB_00115fd9;
    }
    break;
  case k_end:
    uVar7 = (long)(this->list).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->list).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (uVar7 != 0) {
      this->current = (int)(uVar7 >> 5) - 1;
      goto LAB_00116031;
    }
  }
  BaseWindow::setInfoLine((BaseWindow *)this,"",true,true);
switchD_00115f96_caseD_4:
  if (c < 'k') {
    if (c == 'c') {
      pbVar5 = (this->list).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)this->current <
          (ulong)((long)(this->list).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5)) {
        saveContent(this,pbVar5[this->current]._M_dataplus._M_p);
      }
    }
    else if (c == 'd') {
      uVar7 = (ulong)this->current;
      pbVar5 = (this->list).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar7 < (ulong)((long)(this->list).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5)) {
        pos = &this->current;
        local_1a8 = local_198;
        pcVar4 = pbVar5[uVar7]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,pcVar4,pcVar4 + pbVar5[uVar7]._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&this->list,
                   (this->list).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *pos);
        uVar3 = *pos;
        if (((ulong)uVar3 != 0) &&
           ((ulong)((long)(this->list).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->list).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar3)) {
          *pos = uVar3 - 1;
        }
        load(this,pos,true,-1,-1,false);
        pcVar11 = local_1a8;
        pp_Var1 = &local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_1d8._M_impl._0_8_ = pp_Var1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,local_1a8,local_1a8 + local_1a0);
        std::__cxx11::string::append((char *)&local_1d8);
        iVar6 = rename(pcVar11,(char *)local_1d8._M_impl._0_8_);
        if ((_Base_ptr *)local_1d8._M_impl._0_8_ != pp_Var1) {
          operator_delete((void *)local_1d8._M_impl._0_8_);
        }
        pcVar11 = "Cannot remove image file!";
        if (iVar6 == 0) {
          pcVar11 = "";
        }
        BaseWindow::setInfoLine((BaseWindow *)this,pcVar11,true,true);
        if ((this->list).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (this->list).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          BaseWindow::sendClose((BaseWindow *)this);
        }
        if (local_1a8 != local_198) {
          operator_delete(local_1a8);
        }
      }
    }
    goto LAB_00116593;
  }
  if (c == 'k') {
    if ((ulong)this->kp < 3) {
      this->kp = *(keep *)(&DAT_0011b984 + (ulong)this->kp * 4);
    }
  }
  else {
    if (c == 'p') {
      if ((this->vc)._M_string_length != 0) {
        local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1d8._M_impl.super__Rb_tree_header._M_header;
        local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
        pcVar11 = (this->list).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->current]._M_dataplus._M_p;
        local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
        pcVar8 = getenv("CVKIT_SPATH");
        gimage::loadViewProperties((Properties *)&local_1d8,pcVar11,pcVar8,false);
        ImageWindow::visibleImagePart
                  (&this->super_ImageWindow,&local_1e0,&local_1e8,&local_1f0,&local_1f8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\"",1);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,(this->vc)._M_dataplus._M_p,
                            (this->vc)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" \"",3);
        pbVar5 = (this->list).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,pbVar5[this->current]._M_dataplus._M_p,
                   pbVar5[this->current]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",x=",3);
        std::ostream::_M_insert<long>((long)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",y=",3);
        std::ostream::_M_insert<long>((long)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",w=",3);
        std::ostream::_M_insert<long>((long)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,",h=",3);
        std::ostream::_M_insert<long>((long)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\"",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," &",2);
        std::__cxx11::stringbuf::str();
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_218,local_210);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        if (local_218 != local_208) {
          operator_delete(local_218);
        }
        std::__cxx11::stringbuf::str();
        iVar6 = system(local_218);
        if (local_218 != local_208) {
          operator_delete(local_218);
        }
        if (iVar6 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Failed!",7);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_1d8);
      }
      goto LAB_00116593;
    }
    if (c != 'u') goto LAB_00116593;
    bVar10 = this->watch_file;
    this->watch_file = (bool)(bVar10 ^ 1);
    if (bVar10 == false) {
      load(this,&this->current,true,-1,-1,false);
      goto LAB_00116593;
    }
    BaseWindow::removeFileWatch((BaseWindow *)this,this->wid);
  }
  updateTitle(this);
LAB_00116593:
  ImageWindow::onKey(&this->super_ImageWindow,c,key,x,y);
  return;
}

Assistant:

void FileImageWindow::onKey(char c, SpecialKey key, int x, int y)
{
  switch (key)
  {
    case k_home: /* load first image */
      if (current > 0)
      {
        current=0;
        load(current, false);
      }

      setInfoLine("");
      break;

    case k_end: /* load last image */
      if (list.size() > 0)
      {
        current=static_cast<unsigned int>(list.size()-1);
        load(current, true);
      }

      setInfoLine("");
      break;

    case k_left: /* load previous image */
      if (current > 0)
      {
        current--;
        load(current, false);
      }

      setInfoLine("");
      break;

    case k_right: /* load next image */
      current++;

      if (current < list.size())
      {
        load(current, true);
      }
      else
      {
        current--;
      }

      setInfoLine("");
      break;

    default:
      break;
  }

  switch (c)
  {
    case 'u': /* update image and toggle watch flag */
#ifdef INCLUDE_INOTIFY
      watch_file=!watch_file;

      if (watch_file)
      {
        load(current, true);
      }
      else
      {
        removeFileWatch(wid);
        updateTitle();
      }

#else
      load(current, true);
#endif
      break;

    case 'k':
      switch (kp)
      {
        case keep_none:
          kp=keep_most;
          break;

        case keep_most:
          kp=keep_all;
          break;

        case keep_all:
          kp=keep_none;
          break;
      }

      updateTitle();
      break;

    case 'c':
      if (current < list.size())
      {
        saveContent(list[current].c_str());
      }

      break;

    case 'd':
      if (current < list.size())
      {
        std::string name=list[current];

        list.erase(list.begin()+current);

        if (current > 0 && current >= list.size())
        {
          current--;
        }

        load(current, true);

        if (rename(name.c_str(), (name+".bak").c_str()) != 0)
        {
          setInfoLine("Cannot remove image file!");
        }
        else
        {
          setInfoLine("");
        }

        if (list.size() == 0)
        {
          sendClose();
        }
      }

      break;

    case 'p':
      if (vc.size() > 0)
      {
        try
        {
          gutil::Properties prop;
          gimage::loadViewProperties(prop, list[current].c_str(), getenv("CVKIT_SPATH"), false);

          long xp, yp, wp, hp;
          visibleImagePart(xp, yp, wp, hp);

          std::ostringstream out;

#ifdef WIN32
          out << "start \"plyv\" ";
#endif
          out << "\"" << vc << "\" \"";
          out << list[current];
          out << ",x=" << xp;
          out << ",y=" << yp;
          out << ",w=" << wp;
          out << ",h=" << hp;
          out << "\"";
#ifndef WIN32
          out << " &";
#endif
          std::cout << out.str() << std::endl;
		  
          if (system(out.str().c_str()) == -1)
          {
            std::cout << "Failed!" << std::endl;
          }
        }
        catch (const gutil::IOException &)
        {
          setInfoLine("Missing disparity parameter file!");
        }
      }

      break;
  }

  ImageWindow::onKey(c, key, x, y);
}